

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

qint64 __thiscall
QHttpNetworkReplyPrivate::readBody
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,QByteDataBuffer *out)

{
  bool bVar1;
  long *in_RSI;
  QHttpNetworkReplyPrivate *in_RDI;
  QIODevice *unaff_retaddr;
  QHttpNetworkReplyPrivate *in_stack_00000008;
  QIODevice *in_stack_00000010;
  qint64 bytes;
  qint64 in_stack_00000068;
  long local_20;
  QHttpNetworkReplyPrivate *out_00;
  
  out_00 = in_RDI;
  bVar1 = isChunked(in_RDI);
  if (bVar1) {
    local_20 = readReplyBodyChunked(in_stack_00000008,unaff_retaddr,(QByteDataBuffer *)out_00);
  }
  else if (in_RDI->bodyLength < 1) {
    (**(code **)(*in_RSI + 0xa0))();
    local_20 = readReplyBodyRaw((QHttpNetworkReplyPrivate *)bytes,in_stack_00000010,
                                (QByteDataBuffer *)in_stack_00000008,in_stack_00000068);
  }
  else {
    local_20 = readReplyBodyRaw((QHttpNetworkReplyPrivate *)bytes,in_stack_00000010,
                                (QByteDataBuffer *)in_stack_00000008,in_stack_00000068);
    if (in_RDI->contentRead + local_20 == in_RDI->bodyLength) {
      in_RDI->state = AllDoneState;
    }
  }
  in_RDI->contentRead = local_20 + in_RDI->contentRead;
  return local_20;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readBody(QIODevice *socket, QByteDataBuffer *out)
{
    qint64 bytes = 0;

    if (isChunked()) {
        // chunked transfer encoding (rfc 2616, sec 3.6)
        bytes += readReplyBodyChunked(socket, out);
    } else if (bodyLength > 0) {
        // we have a Content-Length
        bytes += readReplyBodyRaw(socket, out, bodyLength - contentRead);
        if (contentRead + bytes == bodyLength)
            state = AllDoneState;
    } else {
        // no content length. just read what's possible
        bytes += readReplyBodyRaw(socket, out, socket->bytesAvailable());
    }
    contentRead += bytes;
    return bytes;
}